

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellCommand.cpp
# Opt level: O3

void __thiscall
llbuild::buildsystem::ShellCommand::executeExternalCommand
          (ShellCommand *this,BuildSystem *system,TaskInterface ti,QueueJobContext *context,
          Optional<std::function<void_(llbuild::basic::ProcessResult)>_> *completionFn)

{
  code *pcVar1;
  ShellCommandHandler *pSVar2;
  HandlerState *pHVar3;
  pointer pSVar4;
  pointer pSVar5;
  pair<llvm::StringRef,_llvm::StringRef> *ppVar6;
  ProcessAttributes attributes;
  void *pvVar7;
  void *pvVar8;
  ArrayRef<llvm::StringRef> commandLine;
  ArrayRef<std::pair<llvm::StringRef,_llvm::StringRef>_> environment;
  TaskInterface local_118;
  undefined1 local_108 [16];
  code *local_f8;
  char local_f0 [8];
  bool local_e8;
  ulong local_e0;
  undefined1 local_d8;
  undefined1 uStack_d7;
  undefined6 uStack_d6;
  pointer pcStack_d0;
  size_type local_c8;
  undefined1 uStack_c0;
  undefined1 uStack_bf;
  undefined6 uStack_be;
  undefined1 local_b8 [48];
  code *local_88;
  char acStack_80 [8];
  bool local_78;
  function<void(llbuild::basic::ProcessResult)> local_70 [8];
  char acStack_68 [8];
  code *local_60;
  char local_58 [8];
  function<void(llbuild::basic::ProcessResult)> local_50 [16];
  code *local_40;
  
  pvVar7 = ti.ctx;
  pvVar8 = ti.impl;
  local_78 = (completionFn->Storage).hasVal;
  local_118.impl = pvVar8;
  local_118.ctx = pvVar7;
  local_b8._0_8_ = this;
  local_b8._8_8_ = system;
  local_b8._16_8_ = pvVar8;
  local_b8._24_8_ = pvVar7;
  if (local_78 == true) {
    local_88 = (code *)0x0;
    acStack_80[0] = '\0';
    acStack_80[1] = '\0';
    acStack_80[2] = '\0';
    acStack_80[3] = '\0';
    acStack_80[4] = '\0';
    acStack_80[5] = '\0';
    acStack_80[6] = '\0';
    acStack_80[7] = '\0';
    local_b8[0x20] = '\0';
    local_b8[0x21] = '\0';
    local_b8[0x22] = '\0';
    local_b8[0x23] = '\0';
    local_b8[0x24] = '\0';
    local_b8[0x25] = '\0';
    local_b8[0x26] = '\0';
    local_b8[0x27] = '\0';
    local_b8[0x28] = '\0';
    local_b8[0x29] = '\0';
    local_b8[0x2a] = '\0';
    local_b8[0x2b] = '\0';
    local_b8[0x2c] = '\0';
    local_b8[0x2d] = '\0';
    local_b8[0x2e] = '\0';
    local_b8[0x2f] = '\0';
    pcVar1 = *(code **)((completionFn->Storage).storage.super_AlignedCharArray<8UL,_32UL>.buffer +
                       0x10);
    if (pcVar1 != (code *)0x0) {
      (*pcVar1)(local_b8 + 0x20,completionFn,2);
      local_88 = *(code **)((completionFn->Storage).storage.super_AlignedCharArray<8UL,_32UL>.buffer
                           + 0x10);
      acStack_80 = *(char (*) [8])
                    ((completionFn->Storage).storage.super_AlignedCharArray<8UL,_32UL>.buffer + 0x18
                    );
    }
  }
  pSVar2 = this->handler;
  if (pSVar2 == (ShellCommandHandler *)0x0) {
    pSVar4 = (this->args).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pSVar5 = (this->args).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    ppVar6 = (pair<llvm::StringRef,_llvm::StringRef> *)
             (this->env).super_SmallVectorImpl<std::pair<llvm::StringRef,_llvm::StringRef>_>.
             super_SmallVectorTemplateBase<std::pair<llvm::StringRef,_llvm::StringRef>,_true>.
             super_SmallVectorTemplateCommon<std::pair<llvm::StringRef,_llvm::StringRef>,_void>.
             super_SmallVectorBase.BeginX;
    local_e0 = (ulong)(this->env).
                      super_SmallVectorImpl<std::pair<llvm::StringRef,_llvm::StringRef>_>.
                      super_SmallVectorTemplateBase<std::pair<llvm::StringRef,_llvm::StringRef>,_true>
                      .
                      super_SmallVectorTemplateCommon<std::pair<llvm::StringRef,_llvm::StringRef>,_void>
                      .super_SmallVectorBase.Size;
    local_d8 = this->canSafelyInterrupt;
    uStack_d7 = 0;
    pcStack_d0 = (this->workingDirectory)._M_dataplus._M_p;
    local_c8 = (this->workingDirectory)._M_string_length;
    uStack_c0 = this->inheritEnv;
    uStack_bf = this->controlEnabled;
    std::function<void(llbuild::basic::ProcessResult)>::
    function<llbuild::buildsystem::ShellCommand::executeExternalCommand(llbuild::buildsystem::BuildSystem&,llbuild::core::TaskInterface,llbuild::basic::QueueJobContext*,llvm::Optional<std::function<void(llbuild::basic::ProcessResult)>>)::__0&,void>
              (local_70,(anon_class_72_4_ab194bda *)local_b8);
    local_e8 = true;
    local_108[0] = '\0';
    local_108[1] = '\0';
    local_108[2] = '\0';
    local_108[3] = '\0';
    local_108[4] = '\0';
    local_108[5] = '\0';
    local_108[6] = '\0';
    local_108[7] = '\0';
    local_108[8] = '\0';
    local_108[9] = '\0';
    local_108[10] = '\0';
    local_108[0xb] = '\0';
    local_108[0xc] = '\0';
    local_108[0xd] = '\0';
    local_108[0xe] = '\0';
    local_108[0xf] = '\0';
    local_f8 = (code *)0x0;
    local_f0[0] = local_58[0];
    local_f0[1] = local_58[1];
    local_f0[2] = local_58[2];
    local_f0[3] = local_58[3];
    local_f0[4] = local_58[4];
    local_f0[5] = local_58[5];
    local_f0[6] = local_58[6];
    local_f0[7] = local_58[7];
    if (local_60 != (code *)0x0) {
      local_108[0] = local_70[0];
      local_108[1] = local_70[1];
      local_108[2] = local_70[2];
      local_108[3] = local_70[3];
      local_108[4] = local_70[4];
      local_108[5] = local_70[5];
      local_108[6] = local_70[6];
      local_108[7] = local_70[7];
      local_108[8] = acStack_68[0];
      local_108[9] = acStack_68[1];
      local_108[10] = acStack_68[2];
      local_108[0xb] = acStack_68[3];
      local_108[0xc] = acStack_68[4];
      local_108[0xd] = acStack_68[5];
      local_108[0xe] = acStack_68[6];
      local_108[0xf] = acStack_68[7];
      local_f8 = local_60;
    }
    attributes.connectToConsole = (bool)uStack_d7;
    attributes.canSafelyInterrupt = (bool)local_d8;
    attributes._2_6_ = uStack_d6;
    attributes.controlEnabled = (bool)uStack_bf;
    attributes.inheritEnvironment = (bool)uStack_c0;
    attributes._26_6_ = uStack_be;
    attributes.workingDir.Data = pcStack_d0;
    attributes.workingDir.Length = local_c8;
    commandLine.Length = (long)pSVar5 - (long)pSVar4 >> 4;
    commandLine.Data = pSVar4;
    environment.Length = local_e0;
    environment.Data = ppVar6;
    core::TaskInterface::spawn
              (&local_118,context,commandLine,environment,attributes,
               (Optional<std::function<void_(llbuild::basic::ProcessResult)>_> *)local_108,
               (ProcessDelegate *)0x0);
    if (local_e8 == true) {
      if (local_f8 != (code *)0x0) {
        (*local_f8)(local_108,local_108,3);
      }
      local_e8 = false;
    }
  }
  else {
    pHVar3 = (this->handlerState)._M_t.
             super___uniq_ptr_impl<llbuild::buildsystem::HandlerState,_std::default_delete<llbuild::buildsystem::HandlerState>_>
             ._M_t.
             super__Tuple_impl<0UL,_llbuild::buildsystem::HandlerState_*,_std::default_delete<llbuild::buildsystem::HandlerState>_>
             .super__Head_base<0UL,_llbuild::buildsystem::HandlerState_*,_false>._M_head_impl;
    std::function<void(llbuild::basic::ProcessResult)>::
    function<llbuild::buildsystem::ShellCommand::executeExternalCommand(llbuild::buildsystem::BuildSystem&,llbuild::core::TaskInterface,llbuild::basic::QueueJobContext*,llvm::Optional<std::function<void(llbuild::basic::ProcessResult)>>)::__0&,void>
              (local_50,(anon_class_72_4_ab194bda *)local_b8);
    (*pSVar2->_vptr_ShellCommandHandler[3])(pSVar2,pHVar3,this,pvVar8,pvVar7,context,local_50);
    if (local_40 != (code *)0x0) {
      (*local_40)(local_50,local_50,3);
    }
  }
  if ((local_78 == true) && (local_88 != (code *)0x0)) {
    (*local_88)(local_b8 + 0x20,local_b8 + 0x20,3);
  }
  return;
}

Assistant:

void ShellCommand::executeExternalCommand(
    BuildSystem& system,
    TaskInterface ti,
    QueueJobContext* context,
    llvm::Optional<ProcessCompletionFn> completionFn) {
  auto commandCompletionFn = [this, &system, ti, completionFn](ProcessResult result) mutable {
    if (result.status != ProcessStatus::Succeeded) {
      // If the command failed, there is no need to gather dependencies.
      if (completionFn.hasValue())
        completionFn.getValue()(result);
      return;
    }

    // Collect the discovered dependencies, if used.
    if (!depsPaths.empty()) {
      ti.spawn(QueueJob{ this, [this, &system, ti, completionFn, result](QueueJobContext* context) mutable {
            if (!processDiscoveredDependencies(system, ti, context)) {
              // If we were unable to process the dependencies output, report a
              // failure.
              if (completionFn.hasValue())
                completionFn.getValue()(ProcessStatus::Failed);
              return;
            }
            if (completionFn.hasValue())
              completionFn.getValue()(result);
          }}, QueueJobPriority::High);
      return;
    }

    if (completionFn.hasValue())
      completionFn.getValue()(result);
  };
      
  // Delegate to the handler, if present.
  if (handler) {
    // FIXME: We should consider making this interface capable of feeding
    // back the dependencies directly.
    //
    // FIXME: This needs to honor certain properties of the execution queue
    // (like indicating when the work starts and stops, and communicating with
    // the execution queue delegate controlling how output is handled). It could
    // be the case that this should actually be delegating this work to run on
    // the execution queue, and the queue handles the handoff.
    handler->execute(
        handlerState.get(), this, ti, context, commandCompletionFn);
    return;
  }

  bool connectToConsole = false;

  // Execute the command.
  ti.spawn(
      context, args, env,
      {canSafelyInterrupt, connectToConsole, workingDirectory, inheritEnv, controlEnabled},
      /*completionFn=*/{commandCompletionFn});
}